

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdline.h
# Opt level: O2

string * __thiscall cmdline::parser::error_abi_cxx11_(string *__return_storage_ptr__,parser *this)

{
  pointer pbVar1;
  allocator local_11;
  
  pbVar1 = (this->errors).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->errors).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish == pbVar1) {
    std::__cxx11::string::string
              ((string *)__return_storage_ptr__,anon_var_dwarf_5588e + 0xb79,&local_11);
  }
  else {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)pbVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string error() const{
    return errors.size()>0?errors[0]:"";
  }